

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

int __thiscall
kj::_::BTreeImpl::verify
          (BTreeImpl *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint height;
  EVP_PKEY_CTX *pEVar1;
  Fault local_38;
  Fault f_1;
  size_t size_local;
  BTreeImpl *this_local;
  FunctionParam<bool_(unsigned_int,_unsigned_int)> f_local;
  
  height = this->height;
  this_local = (BTreeImpl *)sig;
  f_local.space[0] = (void *)siglen;
  MaybeUint::MaybeUint((MaybeUint *)((long)&f_1.exception + 4),(void *)0x0);
  pEVar1 = (EVP_PKEY_CTX *)
           verifyNode(this,(size_t)ctx,
                      (FunctionParam<bool_(unsigned_int,_unsigned_int)> *)&this_local,0,height,
                      f_1.exception._4_4_);
  if (pEVar1 == ctx) {
    return (int)pEVar1;
  }
  Debug::Fault::Fault(&local_38,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                      ,0xcd,FAILED,"verifyNode(size, f, 0, height, nullptr) == size","");
  Debug::Fault::fatal(&local_38);
}

Assistant:

void BTreeImpl::verify(size_t size, FunctionParam<bool(uint, uint)> f) {
  KJ_ASSERT(verifyNode(size, f, 0, height, nullptr) == size);
}